

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListVarDelLiteral(Fxu_Var *pVar,Fxu_Lit *pLink)

{
  int *piVar1;
  Fxu_Lit *pFVar2;
  
  if ((pVar->lLits).pHead == pLink) {
    (pVar->lLits).pHead = pLink->pVNext;
  }
  if ((pVar->lLits).pTail == pLink) {
    (pVar->lLits).pTail = pLink->pVPrev;
  }
  pFVar2 = pLink->pVPrev;
  if (pFVar2 != (Fxu_Lit *)0x0) {
    pFVar2->pVNext = pLink->pVNext;
  }
  if (pLink->pVNext != (Fxu_Lit *)0x0) {
    pLink->pVNext->pVPrev = pFVar2;
  }
  piVar1 = &(pVar->lLits).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Fxu_ListVarDelLiteral( Fxu_Var * pVar, Fxu_Lit * pLink )
{
	Fxu_ListLit * pList = &(pVar->lLits);
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pVNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pVPrev;
	if ( pLink->pVPrev )
		 pLink->pVPrev->pVNext = pLink->pVNext;
	if ( pLink->pVNext )
		 pLink->pVNext->pVPrev = pLink->pVPrev;
	pList->nItems--;
}